

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int memory_write(mtar_t *tar,void *data,size_t size)

{
  ulong uVar1;
  size_t local_40;
  size_t new_capacity;
  size_t request_size;
  char *memory;
  size_t size_local;
  void *data_local;
  mtar_t *tar_local;
  
  if (tar->stream == (void *)0x0) {
    if (size == 0) {
      tar_local._4_4_ = 0;
    }
    else {
      uVar1 = tar->memory_pos + size;
      if (tar->memory_capacity < uVar1) {
        if (uVar1 < 0x401) {
          local_40 = 0x400;
        }
        else {
          local_40 = uVar1 * 2;
        }
        request_size = (size_t)realloc(tar->memory,local_40);
        if ((void *)request_size == (void *)0x0) {
          return -4;
        }
        tar->memory = (void *)request_size;
        tar->memory_size = uVar1;
        tar->memory_capacity = local_40;
      }
      else if (tar->memory_size < uVar1) {
        request_size = (size_t)tar->memory;
        tar->memory_size = uVar1;
      }
      else {
        request_size = (size_t)tar->memory;
        if ((void *)request_size == (void *)0x0) {
          return -4;
        }
      }
      memcpy((void *)(request_size + tar->memory_pos),data,size);
      tar->memory_pos = size + tar->memory_pos;
      tar_local._4_4_ = 0;
    }
  }
  else {
    tar_local._4_4_ = -4;
  }
  return tar_local._4_4_;
}

Assistant:

static int memory_write(mtar_t *tar, const void *data, size_t size) {
  char *memory;
  size_t request_size, new_capacity;

  if (tar->stream)
    return MTAR_EWRITEFAIL;

  if (!size)
    return MTAR_ESUCCESS;

  request_size = tar->memory_pos + size;
  if (request_size > tar->memory_capacity) {
    if (request_size <= 1024)
      new_capacity = 1024;
    else
      new_capacity = request_size * 2;
    memory = (char *)realloc(tar->memory, new_capacity);
    if (!memory) {
      return MTAR_EWRITEFAIL;
    }
    tar->memory = memory;
    tar->memory_size = request_size;
    tar->memory_capacity = new_capacity;
  } else if (request_size > tar->memory_size) {
    memory = (char *)tar->memory;
    tar->memory_size = request_size;
  } else {
    memory = (char *)tar->memory;
    if (!memory) {
      return MTAR_EWRITEFAIL;
    }
  }

  memcpy(&memory[tar->memory_pos], data, size);
  tar->memory_pos += size;

  return MTAR_ESUCCESS;
}